

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

OneWayPipe *
kj::newOneWayPipe(OneWayPipe *__return_storage_ptr__,Maybe<unsigned_long> *expectedLength)

{
  RefOrVoid<kj::(anonymous_namespace)::AsyncPipe> object;
  Own<kj::AsyncInputStream,_std::nullptr_t> *pOVar1;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *params;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *other;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  Own<kj::AsyncOutputStream,_std::nullptr_t> writeEnd;
  Own<kj::AsyncInputStream,_std::nullptr_t> local_88;
  unsigned_long *local_78;
  unsigned_long *l;
  unsigned_long *_l1705;
  undefined1 local_58 [32];
  undefined1 local_38 [8];
  Own<kj::AsyncInputStream,_std::nullptr_t> readEnd;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> impl;
  Maybe<unsigned_long> *expectedLength_local;
  
  refcounted<kj::(anonymous_namespace)::AsyncPipe>();
  object = Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::operator*
                     ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)&readEnd.ptr);
  addRef<kj::(anonymous_namespace)::AsyncPipe>((kj *)local_58,object);
  heap<kj::(anonymous_namespace)::PipeReadEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
            ((kj *)(local_58 + 0x10),
             (Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)local_58);
  Own<kj::AsyncInputStream,decltype(nullptr)>::Own<kj::(anonymous_namespace)::PipeReadEnd,void>
            ((Own<kj::AsyncInputStream,decltype(nullptr)> *)local_38,
             (Own<kj::(anonymous_namespace)::PipeReadEnd,_std::nullptr_t> *)(local_58 + 0x10));
  Own<kj::(anonymous_namespace)::PipeReadEnd,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::PipeReadEnd,_std::nullptr_t> *)(local_58 + 0x10));
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)local_58);
  l = _::readMaybe<unsigned_long>(expectedLength);
  if (l != (unsigned_long *)0x0) {
    local_78 = l;
    pOVar1 = mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                       ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_38);
    heap<kj::(anonymous_namespace)::LimitedInputStream,kj::Own<kj::AsyncInputStream,decltype(nullptr)>,unsigned_long&>
              ((kj *)&writeEnd.ptr,pOVar1,local_78);
    Own<kj::AsyncInputStream,decltype(nullptr)>::
    Own<kj::(anonymous_namespace)::LimitedInputStream,void>
              ((Own<kj::AsyncInputStream,decltype(nullptr)> *)&local_88,
               (Own<kj::(anonymous_namespace)::LimitedInputStream,_std::nullptr_t> *)&writeEnd.ptr);
    Own<kj::AsyncInputStream,_std::nullptr_t>::operator=
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_38,&local_88);
    Own<kj::AsyncInputStream,_std::nullptr_t>::~Own(&local_88);
    Own<kj::(anonymous_namespace)::LimitedInputStream,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::LimitedInputStream,_std::nullptr_t> *)&writeEnd.ptr);
  }
  params = mv<kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
                     ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)&readEnd.ptr);
  heap<kj::(anonymous_namespace)::PipeWriteEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
            ((kj *)local_b8,params);
  Own<kj::AsyncOutputStream,decltype(nullptr)>::Own<kj::(anonymous_namespace)::PipeWriteEnd,void>
            ((Own<kj::AsyncOutputStream,decltype(nullptr)> *)local_a8,
             (Own<kj::(anonymous_namespace)::PipeWriteEnd,_std::nullptr_t> *)local_b8);
  Own<kj::(anonymous_namespace)::PipeWriteEnd,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::PipeWriteEnd,_std::nullptr_t> *)local_b8);
  pOVar1 = mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                     ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_38);
  Own<kj::AsyncInputStream,_std::nullptr_t>::Own(&__return_storage_ptr__->in,pOVar1);
  other = mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                    ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_a8);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::Own(&__return_storage_ptr__->out,other);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_a8);
  Own<kj::AsyncInputStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_38);
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)&readEnd.ptr);
  return __return_storage_ptr__;
}

Assistant:

OneWayPipe newOneWayPipe(kj::Maybe<uint64_t> expectedLength) {
  auto impl = kj::refcounted<AsyncPipe>();
  Own<AsyncInputStream> readEnd = kj::heap<PipeReadEnd>(kj::addRef(*impl));
  KJ_IF_SOME(l, expectedLength) {
    readEnd = kj::heap<LimitedInputStream>(kj::mv(readEnd), l);
  }
  Own<AsyncOutputStream> writeEnd = kj::heap<PipeWriteEnd>(kj::mv(impl));
  return { kj::mv(readEnd), kj::mv(writeEnd) };
}